

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-io.c
# Opt level: O1

errr borg_what_text(wchar_t x,wchar_t y,wchar_t n,uint8_t *a,char *s)

{
  wchar_t wVar1;
  int iVar2;
  wchar_t *pwVar3;
  int *piVar4;
  int iVar5;
  int iVar6;
  ulong uVar7;
  wchar_t wVar8;
  ulong uVar9;
  wchar_t wVar10;
  wchar_t h;
  wchar_t w;
  wchar_t screen_str [1024];
  int local_1040;
  int local_103c;
  wchar_t local_1038 [1026];
  
  wVar10 = -n;
  if (L'\0' < n) {
    wVar10 = n;
  }
  Term_get_size(&local_103c,&local_1040);
  wVar1 = local_103c - x;
  if (wVar10 + x <= local_103c) {
    wVar1 = wVar10;
  }
  uVar9 = (ulong)(uint)wVar1;
  if (wVar1 < L'\x01') {
    uVar9 = 0;
    iVar6 = 0;
  }
  else {
    pwVar3 = Term->scr->c[y];
    piVar4 = Term->scr->a[y];
    uVar7 = 0;
    iVar6 = 0;
    do {
      wVar1 = pwVar3[(long)x + uVar7];
      iVar5 = iVar6;
      wVar8 = L' ';
      if ((((wVar1 != L' ') && (iVar2 = piVar4[(long)x + uVar7], iVar2 != 0)) &&
          (iVar5 = iVar2, wVar8 = wVar1, iVar6 != 0)) && (iVar5 = iVar6, iVar2 != iVar6)) {
        uVar9 = uVar7 & 0xffffffff;
        break;
      }
      iVar6 = iVar5;
      local_1038[uVar7] = wVar8;
      uVar7 = uVar7 + 1;
    } while (uVar7 < uVar9);
  }
  local_1038[uVar9] = L'\0';
  *a = (uint8_t)iVar6;
  wcstombs(s,local_1038,(ulong)(uint)(wVar10 + L'\x01'));
  return (errr)((wchar_t)uVar9 != n && L'\0' < n);
}

Assistant:

errr borg_what_text(int x, int y, int n, uint8_t *a, char *s)
{
    int     i;
    wchar_t screen_str[1024];

    int     t_a;
    wchar_t t_c;

    int     *aa;
    wchar_t *cc;

    int w, h;

    /* Current attribute */
    int d_a = 0;

    /* Max length to scan for */
    int m = ABS(n);

    /* Activate */
    /* Do I need to get the right window? Term_activate(angband_term[0]); */

    /* Obtain the size */
    (void)Term_get_size(&w, &h);

    /* Hack -- Do not run off the screen */
    if (x + m > w)
        m = w - x;

    /* Direct access XXX XXX XXX */
    aa = &(Term->scr->a[y][x]);
    cc = &(Term->scr->c[y][x]);

    /* Grab the string */
    for (i = 0; i < m; i++) {
        /* Access */
        t_a = *aa++;
        t_c = *cc++;

        /* Handle spaces */
        if ((t_c == L' ') || !t_a) {
            /* Save space */
            screen_str[i] = L' ';
        }

        /* Handle real text */
        else {
            /* Attribute ready */
            if (d_a) {
                /* Verify the "attribute" (or stop) */
                if (t_a != d_a)
                    break;
            }

            /* Acquire attribute */
            else {
                /* Save it */
                d_a = t_a;
            }

            /* Save char */
            screen_str[i] = t_c;
        }
    }

    /* Terminate the string */
    screen_str[i] = L'\0';

    /* Save the attribute */
    (*a) = d_a;

    /* Convert back to a char string */
    wcstombs(s, screen_str, ABS(n) + 1);
    /* Too short */
    if ((n > 0) && (i != n))
        return 1;

    /* Success */
    return 0;
}